

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

pool_ptr<soul::heart::Function> __thiscall
soul::heart::Parser::findFunction(Parser *this,string *name,ArrayView<soul::Type> argTypes)

{
  undefined4 uVar1;
  long lVar2;
  string *child;
  size_t sVar3;
  size_type sVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  Function *fn;
  Function *pFVar9;
  Parser *pPVar10;
  Type *pTVar11;
  long *plVar12;
  Type *in_R8;
  long lVar13;
  bool bVar14;
  bool bVar15;
  string_view other;
  ArrayView<soul::Type> argTypes_00;
  ArrayView<soul::Type> argTypes_01;
  _func_int **local_78;
  string local_58;
  long *local_38;
  
  fn = (Function *)argTypes.e;
  pTVar11 = argTypes.s;
  pFVar9 = fn;
  lVar8 = std::__cxx11::string::find((char)argTypes.s,0x3a);
  if (lVar8 == -1) {
    sVar4 = name[4]._M_string_length;
    if (sVar4 == 0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    lVar8 = *(long *)(sVar4 + 0x138);
    bVar14 = lVar8 == 0;
    if (!bVar14) {
      lVar2 = *(long *)(sVar4 + 0x130);
      lVar13 = 0;
      do {
        uVar1 = pTVar11->boundingSize;
        uVar5 = pTVar11->arrayElementBoundingSize;
        other._M_len._4_4_ = uVar5;
        other._M_len._0_4_ = uVar1;
        other._M_str = *(char **)pTVar11;
        bVar15 = Identifier::operator==((Identifier *)(*(long *)(lVar2 + lVar13) + 0x30),other);
        if ((bVar15) &&
           (argTypes_01.e = (Type *)pFVar9, argTypes_01.s = in_R8,
           bVar15 = functionArgTypesMatch(*(Parser **)(lVar2 + lVar13),fn,argTypes_01), bVar15)) {
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser = *(_func_int ***)(lVar2 + lVar13);
          if (!bVar14) {
            return (pool_ptr<soul::heart::Function>)(Function *)this;
          }
          break;
        }
        lVar13 = lVar13 + 8;
        bVar14 = lVar8 << 3 == lVar13;
      } while (!bVar14);
    }
  }
  else {
    lVar8 = *(long *)((long)&name[3].field_2 + 8);
    plVar12 = *(long **)(lVar8 + 0x40);
    local_38 = *(long **)(lVar8 + 0x48);
    local_78 = (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               )._vptr_Tokeniser;
    bVar14 = plVar12 == local_38;
    pPVar10 = this;
    while (pPVar10 = (Parser *)CONCAT71((int7)((ulong)pPVar10 >> 8),bVar14), !bVar14) {
      lVar8 = *(long *)(*plVar12 + 0x138);
      bVar15 = lVar8 == 0;
      if (!bVar15) {
        lVar2 = *(long *)(*plVar12 + 0x130);
        lVar13 = 0;
        do {
          child = *(string **)(*(long *)(lVar2 + lVar13) + 0x30);
          if (child == (string *)0x0) {
            (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser = local_78;
            throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
          }
          TokenisedPathString::join(&local_58,(string *)(*plVar12 + 0x30),child);
          sVar3._0_4_ = pTVar11->boundingSize;
          sVar3._4_4_ = pTVar11->arrayElementBoundingSize;
          if ((local_58._M_string_length == sVar3) &&
             ((local_58._M_string_length == 0 ||
              (iVar7 = bcmp(local_58._M_dataplus._M_p,*(void **)pTVar11,local_58._M_string_length),
              iVar7 == 0)))) {
            argTypes_00.e = (Type *)pPVar10;
            argTypes_00.s = in_R8;
            bVar6 = functionArgTypesMatch(*(Parser **)(lVar2 + lVar13),fn,argTypes_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (bVar6) {
              local_78 = *(_func_int ***)(lVar2 + lVar13);
              if (!bVar15) {
                (this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                )._vptr_Tokeniser = local_78;
                if (bVar14 == false) {
                  return (pool_ptr<soul::heart::Function>)(Function *)this;
                }
                goto LAB_002396b1;
              }
              break;
            }
          }
          else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          lVar13 = lVar13 + 8;
          bVar15 = lVar8 << 3 == lVar13;
        } while (!bVar15);
      }
      plVar12 = plVar12 + 1;
      bVar14 = plVar12 == local_38;
    }
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser = local_78;
  }
LAB_002396b1:
  (this->
  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>)
  ._vptr_Tokeniser = (_func_int **)0x0;
  return (pool_ptr<soul::heart::Function>)(Function *)this;
}

Assistant:

pool_ptr<heart::Function> findFunction (const std::string& name, ArrayView<Type> argTypes)
    {
        if (! containsChar (name, ':'))
        {
            for (auto& fn : module->functions.get())
                if (fn->name == name && functionArgTypesMatch (fn, argTypes))
                    return fn;
        }
        else
        {
            for (auto& m : program.getModules())
                for (auto& fn : m->functions.get())
                    if (TokenisedPathString::join (m->fullName, fn->name) == name && functionArgTypesMatch (fn, argTypes))
                        return fn;
        }

        return {};
    }